

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O1

int FindCollisions<unsigned_int>
              (vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes,
              HashSet<unsigned_int> *collisions,int maxCollisions)

{
  pointer puVar1;
  int iVar2;
  pointer puVar3;
  ulong uVar4;
  long lVar5;
  
  puVar3 = (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar3 != puVar1) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar3,puVar1,(int)LZCOUNT((long)puVar1 - (long)puVar3 >> 2) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar3,puVar1);
  }
  puVar3 = (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = 0;
  if (4 < (ulong)((long)(hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar3)) {
    uVar4 = 1;
    iVar2 = 0;
    lVar5 = 4;
    do {
      if (*(int *)((long)puVar3 + lVar5) == *(int *)((long)puVar3 + lVar5 + -4)) {
        iVar2 = iVar2 + 1;
        if ((int)(collisions->
                 super_set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>).
                 _M_t._M_impl.super__Rb_tree_header._M_node_count < maxCollisions) {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)collisions,(uint *)((long)puVar3 + lVar5));
        }
      }
      uVar4 = uVar4 + 1;
      puVar3 = (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 4;
    } while (uVar4 < (ulong)((long)(hashes->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2));
  }
  return iVar2;
}

Assistant:

int FindCollisions ( std::vector<hashtype> & hashes,
                     HashSet<hashtype> & collisions,
                     int maxCollisions )
{
  int collcount = 0;

  std::sort(hashes.begin(),hashes.end());

  for(size_t hnb = 1; hnb < hashes.size(); hnb++)
  {
    if(hashes[hnb] == hashes[hnb-1])
    {
      collcount++;

      if((int)collisions.size() < maxCollisions)
      {
        collisions.insert(hashes[hnb]);
      }
    }
  }

  return collcount;
}